

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

ssize_t kiste::write(int __fd,void *__buf,size_t __n)

{
  _serializer_t **this;
  bool bVar1;
  reference line_00;
  ssize_t extraout_RAX;
  undefined4 in_register_0000003c;
  parse_context *data;
  line_t *line;
  const_iterator __end1;
  const_iterator __begin1;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> *__range1;
  size_t line_no;
  undefined1 local_a8 [8];
  class_t class_data;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> lineTemplate;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> classTemplate;
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> kissTemplate;
  cpp serializer;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> *lines_local;
  parse_context *ctx_local;
  
  data = (parse_context *)CONCAT44(in_register_0000003c,__fd);
  this = &kissTemplate._serialize;
  cpp::cpp((cpp *)this,data->_os);
  KisteTemplate_generator::operator()
            ((KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
             &classTemplate._serialize,(KisteTemplate_generator *)&KisteTemplate,data,(cpp *)this);
  ClassTemplate_generator::operator()
            ((ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
             &lineTemplate._serialize,(ClassTemplate_generator *)&ClassTemplate,data,(cpp *)this);
  LineTemplate_generator::operator()
            ((LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
             ((long)&class_data._parent_name.field_2 + 8),(LineTemplate_generator *)&LineTemplate,
             data,(cpp *)this);
  std::__cxx11::string::string((string *)local_a8);
  std::__cxx11::string::string((string *)(class_data._name.field_2._M_local_buf + 8));
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_header
            ((KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
             &classTemplate._serialize);
  __range1 = (vector<kiste::line_t,_std::allocator<kiste::line_t>_> *)0x0;
  __end1 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::begin
                     ((vector<kiste::line_t,_std::allocator<kiste::line_t>_> *)__buf);
  line = (line_t *)
         std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::end
                   ((vector<kiste::line_t,_std::allocator<kiste::line_t>_> *)__buf);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_kiste::line_t_*,_std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>_>
                                     *)&line), bVar1) {
    line_00 = __gnu_cxx::
              __normal_iterator<const_kiste::line_t_*,_std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>_>
              ::operator*(&__end1);
    __range1 = (vector<kiste::line_t,_std::allocator<kiste::line_t>_> *)
               ((long)&(__range1->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    switch((line_00->super_line_data_t)._type) {
    case none:
      LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_none
                ((LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
                 ((long)&class_data._parent_name.field_2 + 8));
      break;
    case cpp:
      LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_cpp<kiste::line_t>
                ((LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
                 ((long)&class_data._parent_name.field_2 + 8),line_00);
      break;
    case text:
      LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
      render_text<kiste::line_t>
                ((LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
                 ((long)&class_data._parent_name.field_2 + 8),line_00);
      break;
    case class_begin:
      class_t::operator=((class_t *)local_a8,&(line_00->super_line_data_t)._class_data);
      ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
      render_header<kiste::class_t>
                ((ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
                 &lineTemplate._serialize,(size_t)__range1,(class_t *)local_a8);
      break;
    case class_end:
      ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
      render_footer<kiste::class_t>
                ((ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
                 &lineTemplate._serialize,(size_t)__range1,(class_t *)local_a8);
      break;
    case member:
      ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp>::
      render_member<kiste::class_t,kiste::member_t>
                ((ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp> *)
                 &lineTemplate._serialize,(size_t)__range1,(class_t *)local_a8,
                 &(line_00->super_line_data_t)._member);
    }
    __gnu_cxx::
    __normal_iterator<const_kiste::line_t_*,_std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>_>
    ::operator++(&__end1);
  }
  KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::render_footer
            ((KisteTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)
             &classTemplate._serialize);
  class_t::~class_t((class_t *)local_a8);
  return extraout_RAX;
}

Assistant:

auto write(const parse_context& ctx, const std::vector<line_t>& lines) -> void
  {
    auto serializer = ::kiste::cpp(ctx._os);
    auto kissTemplate = ::kiste::KisteTemplate(ctx, serializer);
    auto classTemplate = ::kiste::ClassTemplate(ctx, serializer);
    auto lineTemplate = ::kiste::LineTemplate(ctx, serializer);

    auto class_data = class_t{};

    kissTemplate.render_header();
    auto line_no = std::size_t{0};
    for (const auto& line : lines)
    {
      ++line_no;
      switch (line._type)
      {
      case line_type::none:
        lineTemplate.render_none();
        break;
      case line_type::cpp:
        lineTemplate.render_cpp(line);
        break;
      case line_type::text:
        lineTemplate.render_text(line);
        break;
      case line_type::class_begin:
        class_data = line._class_data;
        classTemplate.render_header(line_no, class_data);
        break;
      case line_type::member:
        classTemplate.render_member(line_no, class_data, line._member);
        break;
      case line_type::class_end:
        classTemplate.render_footer(line_no, class_data);
        break;
      }
    }
    kissTemplate.render_footer();
  }